

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

void dialer_timer_start_locked(nni_dialer *d)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  
  iVar1 = d->d_maxrtime;
  uVar3 = d->d_currtime;
  if (0 < iVar1) {
    if ((int)(uVar3 * 2) < iVar1) {
      iVar1 = uVar3 * 2;
    }
    d->d_currtime = iVar1;
  }
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = nni_random();
    uVar3 = uVar2 % uVar3;
  }
  nni_sleep_aio(uVar3,&d->d_tmo_aio);
  return;
}

Assistant:

static void
dialer_timer_start_locked(nni_dialer *d)
{
	nni_duration back_off;

	back_off = d->d_currtime;
	if (d->d_maxrtime > 0) {
		d->d_currtime *= 2;
		if (d->d_currtime > d->d_maxrtime) {
			d->d_currtime = d->d_maxrtime;
		}
	}

	// To minimize damage from storms, etc., we select a back-off
	// value randomly, in the range of [0, back_off-1]; this is
	// pretty similar to 802 style back-off, except that we have a
	// nearly uniform time period instead of discrete slot times.
	// This algorithm may lead to slight biases because we don't
	// have a statistically perfect distribution with the modulo of
	// the random number, but this really doesn't matter.
	nni_sleep_aio(back_off ? (nng_duration) (nni_random() % back_off) : 0,
	    &d->d_tmo_aio);
}